

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoApproveReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::AutoApproveReporter::report
          (AutoApproveReporter *this,string *received,string *approved)

{
  ostream *poVar1;
  
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"file ",5);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&::std::cout,(approved->_M_dataplus)._M_p,
                      approved->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," automatically approved - next run should succeed\n",0x32);
  FileUtilsSystemSpecific::copyFile(received,approved);
  return true;
}

Assistant:

bool AutoApproveReporter::report(std::string received, std::string approved) const
    {
        std::cout << "file " << approved
                  << " automatically approved - next run should succeed\n";
        FileUtilsSystemSpecific::copyFile(received, approved);
        return true;
    }